

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
NextLetConstGlobal(SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>
                   *this,int *index,RootObjectBase *instance,PropertyRecord **propertyRecord,
                  Var *value,bool *isConst)

{
  byte bVar1;
  int iVar2;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar3;
  JavascriptString **ppJVar4;
  Var pvVar5;
  bool bVar6;
  int index_00;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord_1;
  Var *local_50;
  PropertyRecord **local_48;
  ScriptContext *local_40;
  uint local_34;
  
  index_00 = *index;
  this_00 = (this->propertyMap).ptr;
  iVar2 = this_00->count - this_00->freeCount;
  bVar6 = index_00 < iVar2;
  if (index_00 < iVar2) {
    local_40 = (((((instance->super_DynamicObject).super_RecyclableObject.type.ptr)->
                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    propertyRecord_1 = (PropertyRecord *)isConst;
    local_50 = value;
    local_48 = propertyRecord;
    do {
      pSVar3 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index_00);
      bVar1 = pSVar3->Attributes;
      if ((bVar1 & 0x10) != 0) {
        local_34 = (uint)pSVar3->propertyIndex;
        ppJVar4 = JsUtil::
                  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        ScriptContext::GetOrAddPropertyRecord(local_40,*ppJVar4,&local_60);
        *local_48 = local_60;
        pvVar5 = DynamicObject::GetSlot(&instance->super_DynamicObject,local_34);
        *local_50 = pvVar5;
        *(byte *)&(propertyRecord_1->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject = bVar1 >> 7;
        *index = *index + 1;
        return bVar6;
      }
      index_00 = *index + 1;
      *index = index_00;
      this_00 = (this->propertyMap).ptr;
      iVar2 = this_00->count - this_00->freeCount;
      bVar6 = index_00 < iVar2;
    } while (index_00 < iVar2);
  }
  return bVar6;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        for (; index < propertyMap->Count(); index++)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = TMapKey_ConvertKey<const PropertyRecord*>(scriptContext, propertyMap->GetKeyAt(index));
                *value = instance->GetSlot(descriptor.propertyIndex);
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }